

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int read_CE(archive_read *a,iso9660 *iso9660)

{
  uint uVar1;
  ulong min;
  file_info *file_00;
  int iVar2;
  read_ce_queue *heap_00;
  void *pvVar3;
  uchar *p_00;
  bool bVar4;
  int r;
  size_t step;
  file_info *file;
  uchar *end;
  uchar *p;
  uchar *b;
  read_ce_queue *heap;
  iso9660 *iso9660_local;
  archive_read *a_local;
  
  heap_00 = &iso9660->read_ce_req;
  min = iso9660->logical_block_size;
  do {
    bVar4 = false;
    if ((iso9660->read_ce_req).cnt != 0) {
      bVar4 = heap_00->reqs->offset == iso9660->current_position;
    }
    if (!bVar4) {
      return 0;
    }
    pvVar3 = __archive_read_ahead(a,min,(ssize_t *)0x0);
    if (pvVar3 == (void *)0x0) {
      archive_set_error(&a->archive,-1,
                        "Failed to read full block when scanning ISO9660 directory list");
      return -0x1e;
    }
    do {
      file_00 = heap_00->reqs->file;
      if (min < file_00->ce_offset + file_00->ce_size) {
        archive_set_error(&a->archive,0x54,"Malformed CE information");
        return -0x1e;
      }
      p_00 = (uchar *)((long)pvVar3 + (ulong)file_00->ce_offset);
      uVar1 = file_00->ce_size;
      next_CE(heap_00);
      iVar2 = parse_rockridge(a,file_00,p_00,p_00 + uVar1);
      if (iVar2 != 0) {
        return -0x1e;
      }
      bVar4 = false;
      if ((iso9660->read_ce_req).cnt != 0) {
        bVar4 = heap_00->reqs->offset == iso9660->current_position;
      }
    } while (bVar4);
    __archive_read_consume(a,min);
    iso9660->current_position = min + iso9660->current_position;
  } while( true );
}

Assistant:

static int
read_CE(struct archive_read *a, struct iso9660 *iso9660)
{
	struct read_ce_queue *heap;
	const unsigned char *b, *p, *end;
	struct file_info *file;
	size_t step;
	int r;

	/* Read data which RRIP "CE" extension points. */
	heap = &(iso9660->read_ce_req);
	step = iso9660->logical_block_size;
	while (heap->cnt &&
	    heap->reqs[0].offset == iso9660->current_position) {
		b = __archive_read_ahead(a, step, NULL);
		if (b == NULL) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Failed to read full block when scanning "
			    "ISO9660 directory list");
			return (ARCHIVE_FATAL);
		}
		do {
			file = heap->reqs[0].file;
			if (file->ce_offset + file->ce_size > step) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Malformed CE information");
				return (ARCHIVE_FATAL);
			}
			p = b + file->ce_offset;
			end = p + file->ce_size;
			next_CE(heap);
			r = parse_rockridge(a, file, p, end);
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		} while (heap->cnt &&
		    heap->reqs[0].offset == iso9660->current_position);
		/* NOTE: Do not move this consume's code to fron of
		 * do-while loop. Registration of nested CE extension
		 * might cause error because of current position. */
		__archive_read_consume(a, step);
		iso9660->current_position += step;
	}
	return (ARCHIVE_OK);
}